

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O2

bool __thiscall ScParser::parseFunctionDecl(ScParser *this,char **data)

{
  bool bVar1;
  
  this->m_hasCurrentState = false;
  bVar1 = expectString<20ul>(data,(char (*) [20])0x11a01c);
  if (!bVar1) {
    bVar1 = parseReactMethod(this,data);
    return bVar1;
  }
  expectString<44ul>(data,(char (*) [44])"detail::reaction_result boost::statechart::");
  bVar1 = expectString<15ul>(data,(char (*) [15])"state_machine<");
  if (bVar1) {
    parseStateMachine(this,data);
  }
  else {
    bVar1 = expectString<14ul>(data,(char (*) [14])0x11a0af);
    if (!bVar1) {
      return false;
    }
    parseSimpleState(this,data);
  }
  return true;
}

Assistant:

bool ScParser::parseFunctionDecl(char *&data)
{
    m_hasCurrentState = false;

    // boost::statechart::detail::reaction_result
    //     boost::statechart::simple_state< *state-spec* >::
    //         local_react<boost::mpl::list<
    //                         boost::statechart::custom_reaction< *event-name* >,
    //                         boost::statechart::deferral< * event-name * >,
    //                         mpl_::na, ..., mpl_::na> >(
    //                            boost::statechart::event_base const&, void const*)>

    if (expectStartsWith(data, "boost::statechart::")) {
        expectStartsWith(data, "detail::reaction_result boost::statechart::");
        // boost::statechart::state_machine<fsm::StateMachine, fsm::NotStarted, ...
        if (expectStartsWith(data, "state_machine<")) {
            parseStateMachine(data);
            return true;
        }
        // boost::statechart::simple_state<fsm::NotStarted, fsm::StateMachine, ...
        if (expectStartsWith(data, "simple_state<")) {
            parseSimpleState(data);
            return true;
        }
        return false;
    }
    return parseReactMethod(data);
}